

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ryg_dxt.cpp
# Opt level: O0

void ryg_dxt::sCompressDXTBlock(sU8 *dest,sU32 *src,sBool alpha,sInt quality)

{
  sInt quality_local;
  sBool alpha_local;
  sU32 *src_local;
  sU8 *dest_local;
  
  src_local = (sU32 *)dest;
  if (alpha) {
    CompressAlphaBlock(dest,src);
    src_local = (sU32 *)(dest + 8);
  }
  CompressColorBlock((sU8 *)src_local,src,quality);
  return;
}

Assistant:

void sCompressDXTBlock(sU8* dest, const sU32* src, sBool alpha, sInt quality) {
  CRNLIB_ASSERT(Expand5[1]);

  // if alpha specified, compress alpha as well
  if (alpha) {
    CompressAlphaBlock(dest, src);
    dest += 8;
  }

  // compress the color part
  CompressColorBlock(dest, src, quality);
}